

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O2

void complex_multiply_add(float *dst,float *l,float *r,uint32_t size)

{
  float fVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  for (uVar4 = 1; uVar5 = uVar4 - 1, uVar5 < size; uVar4 = uVar4 + 2) {
    auVar7._0_4_ = -l[uVar4];
    auVar7._4_4_ = 0x80000000;
    auVar7._8_4_ = 0x80000000;
    auVar7._12_4_ = 0x80000000;
    uVar2 = *(ulong *)(r + uVar5);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar2;
    auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)l[uVar4]),0x1c);
    auVar8 = vshufps_avx(auVar8,auVar8,0xe1);
    fVar1 = l[uVar5];
    auVar6._0_4_ = (float)*(undefined8 *)(dst + uVar5) +
                   fVar1 * (float)uVar2 + auVar8._0_4_ * auVar7._0_4_;
    auVar6._4_4_ = (float)((ulong)*(undefined8 *)(dst + uVar5) >> 0x20) +
                   fVar1 * (float)(uVar2 >> 0x20) + auVar8._4_4_ * auVar7._4_4_;
    auVar6._8_4_ = fVar1 * 0.0 + auVar8._8_4_ * auVar7._8_4_ + 0.0;
    auVar6._12_4_ = fVar1 * 0.0 + auVar8._12_4_ * auVar7._12_4_ + 0.0;
    uVar3 = vmovlps_avx(auVar6);
    *(undefined8 *)(dst + uVar5) = uVar3;
  }
  return;
}

Assistant:

VECTORIZE void complex_multiply_add(float *restrict dst, float *restrict l, float *restrict r, uint32_t size){
  for(uint32_t k = 0; k < size; k+= 2){
    float reA = l[k+0];
    float imA = l[k+1];
    float reB = r[k+0];
    float imB = r[k+1];

    float re = reA * reB - imA * imB;
    float im = reA * imB + imA * reB;

    dst[k+0] += re;
    dst[k+1] += im;
  }
}